

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O1

void __thiscall QtMWidgets::Stepper::mousePressEvent(Stepper *this,QMouseEvent *event)

{
  StepperPrivate *pSVar1;
  Button BVar2;
  QMouseEvent QVar3;
  double dVar4;
  double in_XMM1_Qa;
  QPoint local_28;
  
  if (*(int *)(event + 0x40) == 1) {
    QTimer::stop();
    pSVar1 = (this->d).d;
    pSVar1->timeout = 500;
    pSVar1->autorepeatCount = 0;
    dVar4 = (double)QEventPoint::position();
    local_28.xp = (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4);
    local_28.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                       in_XMM1_Qa);
    BVar2 = StepperPrivate::buttonPressed(pSVar1,&local_28);
    pSVar1 = (this->d).d;
    pSVar1->button = BVar2;
    StepperPrivate::makeClick(pSVar1);
    pSVar1 = (this->d).d;
    QVar3 = (QMouseEvent)0x1;
    if (pSVar1->autorepeat == true) {
      QTimer::start((int)pSVar1->timer);
    }
  }
  else {
    QVar3 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar3;
  return;
}

Assistant:

void
Stepper::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->timer->stop();

		d->autorepeatCount = 0;
		d->timeout = defaultTimeout;

		d->button = d->buttonPressed( event->pos() );

		d->makeClick();

		if( d->autorepeat )
			d->timer->start( d->timeout );

		event->accept();
	}
	else
		event->ignore();
}